

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void createclibstable(lua_State *L)

{
  lua_State *L_local;
  
  lua_createtable(L,0,0);
  lua_createtable(L,0,1);
  lua_pushcclosure(L,gctm,0);
  lua_setfield(L,-2,"__gc");
  lua_setmetatable(L,-2);
  lua_rawsetp(L,-0xf4628,&CLIBS);
  return;
}

Assistant:

static void createclibstable (lua_State *L) {
  lua_newtable(L);  /* create CLIBS table */
  lua_createtable(L, 0, 1);  /* create metatable for CLIBS */
  lua_pushcfunction(L, gctm);
  lua_setfield(L, -2, "__gc");  /* set finalizer for CLIBS table */
  lua_setmetatable(L, -2);
  lua_rawsetp(L, LUA_REGISTRYINDEX, &CLIBS);  /* set CLIBS table in registry */
}